

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

void __thiscall
DListBase<Js::RecyclableObject_*,_RealCount>::Clear<Memory::HeapAllocator>
          (DListBase<Js::RecyclableObject_*,_RealCount> *this,HeapAllocator *allocator)

{
  DListNode<Js::RecyclableObject_*> *pDVar1;
  DListNode<Js::RecyclableObject_*> *obj;
  
  obj = (this->super_DListNodeBase<Js::RecyclableObject_*>).next.node;
  while (obj != (DListNode<Js::RecyclableObject_*> *)this) {
    pDVar1 = (obj->super_DListNodeBase<Js::RecyclableObject_*>).next.node;
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<Js::RecyclableObject*>>
              (allocator,obj);
    obj = pDVar1;
  }
  (this->super_DListNodeBase<Js::RecyclableObject_*>).next.list = this;
  (this->super_DListNodeBase<Js::RecyclableObject_*>).prev.list = this;
  (this->super_RealCount).count = 0;
  return;
}

Assistant:

void Clear(TAllocator * allocator)
    {
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            AllocatorDelete(TAllocator, allocator, (Node *)current);
            current = next;
        }

        this->Next() = this;
        this->Prev() = this;
        this->SetCount(0);
    }